

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactShape.cpp
# Opt level: O1

void __thiscall
btGImpactMeshShapePart::processAllTrianglesRay
          (btGImpactMeshShapePart *this,btTriangleCallback *callback,btVector3 *rayFrom,
          btVector3 *rayTo)

{
  uint uVar1;
  int iVar2;
  btVector3 bVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  btAlignedObjectArray<int> collided;
  btPrimitiveTriangle triangle;
  btVector3 local_a8;
  btAlignedObjectArray<int> local_98;
  undefined1 local_78 [64];
  undefined4 local_38;
  
  (*(this->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
    _vptr_btCollisionShape[0x1c])();
  local_98.m_ownsMemory = true;
  local_98.m_data = (int *)0x0;
  local_98.m_size = 0;
  local_98.m_capacity = 0;
  fVar9 = rayTo->m_floats[2] - rayFrom->m_floats[2];
  fVar7 = (float)*(undefined8 *)rayTo->m_floats - (float)*(undefined8 *)rayFrom->m_floats;
  fVar8 = (float)((ulong)*(undefined8 *)rayTo->m_floats >> 0x20) -
          (float)((ulong)*(undefined8 *)rayFrom->m_floats >> 0x20);
  local_a8.m_floats[1] = fVar8;
  local_a8.m_floats[0] = fVar7;
  local_a8.m_floats[2] = fVar9;
  local_a8.m_floats[3] = 0.0;
  fVar7 = fVar9 * fVar9 + fVar7 * fVar7 + fVar8 * fVar8;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  bVar3.m_floats = local_a8.m_floats;
  fVar7 = 1.0 / fVar7;
  fVar8 = local_a8.m_floats[0];
  local_a8.m_floats[1] = fVar7 * local_a8.m_floats[1];
  local_a8.m_floats[0] = fVar7 * fVar8;
  local_a8.m_floats[2] = bVar3.m_floats[2];
  local_a8.m_floats[3] = bVar3.m_floats[3];
  local_a8.m_floats[2] = fVar7 * local_a8.m_floats[2];
  btGImpactQuantizedBvh::rayQuery
            (&(this->super_btGImpactShapeInterface).m_box_set,&local_a8,rayFrom,&local_98);
  lVar5 = (long)local_98.m_size;
  if (lVar5 == 0) {
    (*(this->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1d])(this);
  }
  else {
    uVar1 = *(uint *)&this->field_0xe0;
    local_38 = 0x3c23d70a;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      iVar2 = local_98.m_data[lVar5];
      iVar4 = (*(this->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
                _vptr_btCollisionShape[0x15])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x28))
                ((long *)CONCAT44(extraout_var,iVar4),iVar2,local_78);
      (*callback->_vptr_btTriangleCallback[2])
                (callback,local_78,(ulong)uVar1,(ulong)(uint)local_98.m_data[lVar5]);
    }
    (*(this->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1d])(this);
  }
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_98);
  return;
}

Assistant:

void btGImpactMeshShapePart::processAllTrianglesRay(btTriangleCallback* callback,const btVector3& rayFrom, const btVector3& rayTo) const
{
	lockChildShapes();

	btAlignedObjectArray<int> collided;
	btVector3 rayDir(rayTo - rayFrom);
	rayDir.normalize();
	m_box_set.rayQuery(rayDir, rayFrom, collided);

	if(collided.size()==0)
	{
		unlockChildShapes();
		return;
	}

	int part = (int)getPart();
	btPrimitiveTriangle triangle;
	int i = collided.size();
	while(i--)
	{
		getPrimitiveTriangle(collided[i],triangle);
		callback->processTriangle(triangle.m_vertices,part,collided[i]);
	}
	unlockChildShapes();
}